

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3ExprCodeGetColumn(Parse *pParse,Table *pTab,int iColumn,int iTable,int iReg,u8 p5)

{
  VdbeOp *pVVar1;
  VdbeOp *pOp;
  u8 p5_local;
  int iReg_local;
  int iTable_local;
  int iColumn_local;
  Table *pTab_local;
  Parse *pParse_local;
  
  sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe,pTab,iTable,iColumn,iReg);
  if ((p5 != '\0') && (pVVar1 = sqlite3VdbeGetLastOp(pParse->pVdbe), pVVar1->opcode == '^')) {
    pVVar1->p5 = (ushort)p5;
  }
  return iReg;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprCodeGetColumn(
  Parse *pParse,   /* Parsing and code generating context */
  Table *pTab,     /* Description of the table we are reading from */
  int iColumn,     /* Index of the table column */
  int iTable,      /* The cursor pointing to the table */
  int iReg,        /* Store results here */
  u8 p5            /* P5 value for OP_Column + FLAGS */
){
  assert( pParse->pVdbe!=0 );
  sqlite3ExprCodeGetColumnOfTable(pParse->pVdbe, pTab, iTable, iColumn, iReg);
  if( p5 ){
    VdbeOp *pOp = sqlite3VdbeGetLastOp(pParse->pVdbe);
    if( pOp->opcode==OP_Column ) pOp->p5 = p5;
  }
  return iReg;
}